

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitfoot.cpp
# Opt level: O1

void __thiscall bitfoot::Bitfoot::Initialize(Bitfoot *this)

{
  long lVar1;
  int64_t iVar2;
  int iVar3;
  long lVar4;
  Bitfoot *pBVar5;
  long lVar6;
  long *local_40;
  size_t local_38;
  long local_30 [2];
  
  this->ply = 0;
  this->child = (Bitfoot *)&_node;
  this->parent = (Bitfoot *)0x0;
  iVar3 = 1;
  lVar4 = 0;
  do {
    *(int *)(&DAT_00163470 + lVar4) = iVar3;
    lVar1 = lVar4 + 0xbe8;
    lVar6 = 0;
    if (lVar4 != 0x49ab8) {
      lVar6 = (long)&DAT_00164018 + lVar4;
    }
    *(long *)(&DAT_00163468 + lVar4) = lVar6;
    pBVar5 = (Bitfoot *)(_hist + lVar4 + 0xf578);
    if (lVar4 == 0) {
      pBVar5 = this;
    }
    *(Bitfoot **)(&DAT_00163460 + lVar4) = pBVar5;
    iVar3 = iVar3 + 1;
    lVar4 = lVar1;
  } while (lVar1 != 0x4a6a0);
  _hashSize = senjo::EngineOption::GetIntValue((EngineOption *)_optHash);
  iVar2 = senjo::EngineOption::GetIntValue((EngineOption *)_optContempt);
  _contempt = (undefined4)iVar2;
  iVar2 = senjo::EngineOption::GetIntValue((EngineOption *)_optDelta);
  _delta = (undefined4)iVar2;
  iVar2 = senjo::EngineOption::GetIntValue((EngineOption *)_optFutility);
  _futility = (undefined4)iVar2;
  iVar2 = senjo::EngineOption::GetIntValue((EngineOption *)_optRZR);
  _rzr = (undefined4)iVar2;
  iVar2 = senjo::EngineOption::GetIntValue((EngineOption *)_optTempo);
  _tempo = (undefined4)iVar2;
  iVar2 = senjo::EngineOption::GetIntValue((EngineOption *)_optTest);
  __test = (undefined4)iVar2;
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,_optEXT._48_8_,_optEXT._56_8_ + _optEXT._48_8_);
  if (local_38 == DAT_001532b0) {
    if (local_38 == 0) {
      _ext = true;
    }
    else {
      iVar3 = bcmp(local_40,_TRUE_abi_cxx11_,local_38);
      _ext = iVar3 == 0;
    }
  }
  else {
    _ext = false;
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,_optIID._48_8_,_optIID._56_8_ + _optIID._48_8_);
  if (local_38 == DAT_001532b0) {
    if (local_38 == 0) {
      _iid = true;
    }
    else {
      iVar3 = bcmp(local_40,_TRUE_abi_cxx11_,local_38);
      _iid = iVar3 == 0;
    }
  }
  else {
    _iid = false;
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,_optLMR._48_8_,_optLMR._56_8_ + _optLMR._48_8_);
  if (local_38 == DAT_001532b0) {
    if (local_38 == 0) {
      _lmr = true;
    }
    else {
      iVar3 = bcmp(local_40,_TRUE_abi_cxx11_,local_38);
      _lmr = iVar3 == 0;
    }
  }
  else {
    _lmr = false;
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,_optNMP._48_8_,_optNMP._56_8_ + _optNMP._48_8_);
  if (local_38 == DAT_001532b0) {
    if (local_38 == 0) {
      _nmp = true;
    }
    else {
      iVar3 = bcmp(local_40,_TRUE_abi_cxx11_,local_38);
      _nmp = iVar3 == 0;
    }
  }
  else {
    _nmp = false;
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,_optNMR._48_8_,_optNMR._56_8_ + _optNMR._48_8_);
  if (local_38 == DAT_001532b0) {
    if (local_38 == 0) {
      _nmr = true;
    }
    else {
      iVar3 = bcmp(local_40,_TRUE_abi_cxx11_,local_38);
      _nmr = iVar3 == 0;
    }
  }
  else {
    _nmr = false;
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,_optOneReply._48_8_,_optOneReply._56_8_ + _optOneReply._48_8_);
  if (local_38 == DAT_001532b0) {
    if (local_38 == 0) {
      _oneReply = true;
    }
    else {
      iVar3 = bcmp(local_40,_TRUE_abi_cxx11_,local_38);
      _oneReply = iVar3 == 0;
    }
  }
  else {
    _oneReply = false;
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  memset(_hist,0,0x10000);
  SetHashSize(this,_hashSize);
  (*(this->super_ChessEngine)._vptr_ChessEngine[9])(this,senjo::ChessEngine::_STARTPOS);
  _initialized = 1;
  return;
}

Assistant:

void Bitfoot::Initialize()
{
  ply = 0;
  child = _node;
  parent = NULL;
  for (int i = 0; i < MaxPlies; ++i) {
    _node[i].ply = (i + 1);
    _node[i].child = ((i + 1) < MaxPlies) ? &(_node[i + 1]) : NULL;
    _node[i].parent = (i > 0) ? &(_node[i - 1]) : this;
  }

  _hashSize = _optHash.GetIntValue();
  _contempt = static_cast<int>(_optContempt.GetIntValue());
  _delta    = static_cast<int>(_optDelta.GetIntValue());
  _futility = static_cast<int>(_optFutility.GetIntValue());
  _rzr      = static_cast<int>(_optRZR.GetIntValue());
  _tempo    = static_cast<int>(_optTempo.GetIntValue());
  _test     = static_cast<int>(_optTest.GetIntValue());
  _ext      = (_optEXT.GetValue() == _TRUE);
  _iid      = (_optIID.GetValue() == _TRUE);
  _lmr      = (_optLMR.GetValue() == _TRUE);
  _nmp      = (_optNMP.GetValue() == _TRUE);
  _nmr      = (_optNMR.GetValue() == _TRUE);
  _oneReply = (_optOneReply.GetValue() == _TRUE);

  ClearHistory();
  SetHashSize(_hashSize);
  SetPosition(_STARTPOS);

  _initialized = true;
}